

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O0

ASTNode * ParseFunc(Scope *scope,Lexer *lexer)

{
  Token tok_00;
  int iVar1;
  ASTNode *pAVar2;
  char *pcVar3;
  size_t sVar4;
  ASTNode *pAVar5;
  ASTList *pAVar6;
  Token tok;
  ASTNode *func;
  Lexer *lexer_local;
  Scope *scope_local;
  
  pAVar2 = GetNextNode(scope);
  pAVar2->type = FUNC;
  tok_00 = GetNextToken(lexer);
  if (tok_00 != IDENTIFIER) {
    pcVar3 = TokenToString(tok_00);
    printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","IDENTIFIER",pcVar3,
           (ulong)(uint)(lexer->tracker).row,
           (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
    exit(0);
  }
  sVar4 = strlen(lexer->currentTokenString);
  pAVar5 = (ASTNode *)Allocate((int)sVar4 + 1);
  (pAVar2->meta).binaryExpr.right = pAVar5;
  strcpy((pAVar2->meta).funcExpr.name,lexer->currentTokenString);
  pAVar6 = ParseParams(scope,lexer,true);
  (pAVar2->meta).funcExpr.params = pAVar6;
  iVar1 = ParseBody(scope,lexer);
  (pAVar2->meta).funcExpr.body = iVar1;
  return pAVar2;
}

Assistant:

ASTNode* ParseFunc(Scope* scope, Lexer* lexer){
	TRACK();
	ASTNode* func = GetNextNode(scope);
	SET_NODE_TYPE(func, FUNC);
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, IDENTIFIER, lexer);
	DEBUG_PRINT_SYNTAX2("Func", lexer->currentTokenString);

	SET_FUNC_NAME(func, Allocate((sizeof(char) * strlen(lexer->currentTokenString)) + sizeof(char)));
	strcpy(GET_FUNC_NAME(func), lexer->currentTokenString);

	SET_FUNC_PARAMS(func, ParseParams(scope, lexer, true));
	SET_FUNC_BODY(func, ParseBody(scope, lexer));
	// SET_IS_STMT(func);
	return func;
}